

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::str_writer<char>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
           *this,align_spec *spec,str_writer<char> *f)

{
  byte bVar1;
  ulong uVar2;
  long *plVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  char __tmp;
  size_t __n;
  size_t size;
  void *pvVar7;
  void *pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  ulong __n_00;
  size_t __len;
  size_t __n_01;
  
  uVar6 = (ulong)spec->width_;
  uVar2 = f->size_;
  plVar3 = *(long **)this;
  lVar4 = plVar3[1];
  __n_01 = uVar6 - uVar2;
  if (uVar6 < uVar2 || __n_01 == 0) {
    std::__cxx11::string::resize((ulong)plVar3,(char)uVar2 + (char)lVar4);
    __n = f->size_;
    if (__n != 0) {
      pvVar8 = (void *)(lVar4 + *plVar3);
LAB_0011b26c:
      memmove(pvVar8,f->s,__n);
      return;
    }
  }
  else {
    std::__cxx11::string::resize((ulong)plVar3,(char)lVar4 + (char)spec->width_);
    pvVar7 = (void *)(lVar4 + *plVar3);
    bVar1 = (byte)spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      __n_00 = __n_01 >> 1;
      pvVar8 = pvVar7;
      if (1 < __n_01) {
        pvVar8 = (void *)((long)pvVar7 + __n_00);
        memset(pvVar7,(uint)bVar1,__n_00);
      }
      sVar5 = f->size_;
      if (sVar5 != 0) {
        memmove(pvVar8,f->s,sVar5);
      }
      if (uVar6 != uVar2) {
        __n_01 = __n_01 - __n_00;
        pvVar7 = (void *)((long)pvVar8 + sVar5);
LAB_0011b30f:
        memset(pvVar7,(uint)bVar1,__n_01);
        return;
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      pvVar8 = pvVar7;
      if (uVar6 != uVar2) {
        pvVar8 = (void *)((long)pvVar7 + __n_01);
        memset(pvVar7,(uint)bVar1,__n_01);
      }
      __n = f->size_;
      if (__n != 0) goto LAB_0011b26c;
    }
    else {
      sVar5 = f->size_;
      if (sVar5 != 0) {
        memmove(pvVar7,f->s,sVar5);
      }
      if (uVar6 != uVar2) {
        pvVar7 = (void *)((long)pvVar7 + sVar5);
        goto LAB_0011b30f;
      }
    }
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }